

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalSamePower(WSNTopologyBasedEnergy *this)

{
  WSNNode *pWVar1;
  Scalar *pSVar2;
  double *pdVar3;
  int iVar4;
  WSNNode *pWVar5;
  WSNTopologyBasedEnergy *this_00;
  WSNTopologyBasedEnergy *pWVar6;
  pointer piVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> _array;
  long *local_160 [2];
  long local_150 [2];
  _InputArray local_140;
  WSNNode *local_128;
  WSNNode *local_120;
  WSNNode *local_118;
  WSNNode *local_110;
  WSNNode *local_108;
  vector<int,_std::allocator<int>_> local_100;
  WSNNode local_e8;
  WSNNode local_a8;
  undefined1 local_70 [64];
  
  SelectServalNode(&local_100,this);
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_118 = this->LayerLeaderNode + 2;
    local_110 = this->LayerLeaderNode + 1;
    local_108 = this->LayerLeaderNode;
    pWVar6 = (WSNTopologyBasedEnergy *)(local_70 + 0x20);
    local_128 = this->LayerLeaderNode + 4;
    local_120 = this->LayerLeaderNode + 3;
    piVar7 = local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      SelectLeaderID(this);
      iVar4 = WSNNode::layer(this->node + *piVar7);
      pWVar5 = local_108;
      if (iVar4 != 0) {
        iVar4 = WSNNode::layer(this->node + *piVar7);
        pWVar5 = local_110;
        if (iVar4 != 1) {
          iVar4 = WSNNode::layer(this->node + *piVar7);
          pWVar5 = local_118;
          if (iVar4 != 2) {
            iVar4 = WSNNode::layer(this->node + *piVar7);
            pWVar5 = local_120;
            if (iVar4 != 3) {
              pWVar5 = local_128;
            }
          }
        }
      }
      iVar4 = WSNNode::GetNodeID(pWVar5);
      this->node[iVar4].energy = this->node[iVar4].energy + -10.0;
      iVar4 = *piVar7;
      this->node[iVar4].energy = this->node[iVar4].energy + -7.0;
      local_a8.leaderID = this->node[iVar4].leaderID;
      local_a8.id = this->node[iVar4].id;
      pWVar5 = this->node + iVar4;
      local_a8.x = pWVar5->x;
      local_a8.y = pWVar5->y;
      local_a8.energy = pWVar5->energy;
      pSVar2 = &this->node[iVar4].color;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar3 = this->node[iVar4].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
      this_00 = pWVar6;
      WSNNode::NodeColor((Scalar *)pWVar6,this->node + iVar4);
      drawCrossNode(this_00,&this->img,&local_a8,(Scalar *)pWVar6);
      WSNNode::~WSNNode(&local_a8);
      local_160[0] = local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"WSN","");
      local_140.sz.width = 0;
      local_140.sz.height = 0;
      local_140.flags = 0x1010000;
      local_140.obj = this;
      cv::imshow((string *)local_160,&local_140);
      if (local_160[0] != local_150) {
        operator_delete(local_160[0],local_150[0] + 1);
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  lVar8 = 0x18e8;
  do {
    pWVar5 = (WSNNode *)((long)(&(this->sink).color + -4) + lVar8);
    iVar4 = WSNNode::GetNodeID(pWVar5);
    local_e8.leaderID = this->node[iVar4].leaderID;
    local_e8.id = this->node[iVar4].id;
    pWVar1 = this->node + iVar4;
    local_e8.x = pWVar1->x;
    local_e8.y = pWVar1->y;
    local_e8.energy = pWVar1->energy;
    pSVar2 = &this->node[iVar4].color;
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
         (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
    pdVar3 = this->node[iVar4].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
    iVar4 = WSNNode::GetNodeID(pWVar5);
    pWVar6 = (WSNTopologyBasedEnergy *)local_70;
    WSNNode::NodeColor((Scalar *)pWVar6,this->node + iVar4);
    drawCrossNode(pWVar6,&this->img,&local_e8,(Scalar *)local_70);
    WSNNode::~WSNNode(&local_e8);
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"WSN","");
    local_140.sz.width = 0;
    local_140.sz.height = 0;
    local_140.flags = 0x1010000;
    local_140.obj = this;
    cv::imshow((string *)local_160,&local_140);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0x1a00);
  if (this->Test != false) {
    cv::waitKey(400);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::NodeSentSignalSamePower()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		//选择每层的leader节点
		SelectLeaderID();

		//计算能量变化值
		if(0==node[*it].layer())
		{
			//LayerLeaderNode[0].energy-=1+alpha * DistanceBetweenNodes(LayerLeaderNode[0],Link);
			node[LayerLeaderNode[0].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(1==node[*it].layer())
		{
			//LayerLeaderNode[1].energy-=5;
			node[LayerLeaderNode[1].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(2==node[*it].layer())
		{
			//LayerLeaderNode[2].energy-=5;
			node[LayerLeaderNode[2].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		else if(3==node[*it].layer())
		{
			//LayerLeaderNode[3].energy-=5;
			node[LayerLeaderNode[3].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else 
		{
			//LayerLeaderNode[4].energy-=5;
			node[LayerLeaderNode[4].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<LayerNum;i++)
	{
		drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}